

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O3

void Wln_ReadNdrTest(void)

{
  Wln_ReadNdr("D:\\temp\\brijesh\\for_alan_dff_warning\\work_fir_filter_fir_filter_proc_out.ndr");
  Wln_WriteVer((Wln_Ntk_t *)0x0,"test__test.v");
  Wln_NtkPrint((Wln_Ntk_t *)0x0);
  Wln_NtkStaticFanoutTest((Wln_Ntk_t *)0x0);
  Wln_NtkFree((Wln_Ntk_t *)0x0);
  return;
}

Assistant:

void Wln_ReadNdrTest()
{
    Wln_Ntk_t * pNtk = Wln_ReadNdr( "D:\\temp\\brijesh\\for_alan_dff_warning\\work_fir_filter_fir_filter_proc_out.ndr" );
    //Wln_Ntk_t * pNtk = Wln_ReadNdr( "flop.ndr" );
    Wln_WriteVer( pNtk, "test__test.v" );
    Wln_NtkPrint( pNtk );
    Wln_NtkStaticFanoutTest( pNtk );
    Wln_NtkFree( pNtk );
}